

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O0

void Res_WinAddMissing(Res_Win_t *p)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_1c;
  int i;
  Abc_Obj_t *pObj;
  Res_Win_t *p_local;
  
  Abc_NtkIncrementTravId(p->pNode->pNtk);
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vLeaves), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p->vLeaves,local_1c);
    Abc_NodeSetTravIdCurrent(pAVar2);
  }
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vNodes), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p->vNodes,local_1c);
    Abc_NodeSetTravIdCurrent(pAVar2);
  }
  Vec_PtrClear(p->vBranches);
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vRoots), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p->vRoots,local_1c);
    Res_WinAddMissing_rec(p,pAVar2,p->nLevTravMin);
  }
  return;
}

Assistant:

void Res_WinAddMissing( Res_Win_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    // mark the leaves
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );        
    // mark the already collected nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );        
    // explore from the roots
    Vec_PtrClear( p->vBranches );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        Res_WinAddMissing_rec( p, pObj, p->nLevTravMin );
}